

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O0

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingBlackOnWhiteProducesGrayDependingOnInvertedCover
          (GenericRGBXBlenderTests *this)

{
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
  *this_00;
  allocator local_b1;
  string local_b0 [32];
  LocationInfo local_90;
  undefined8 local_68;
  pixel reference [7];
  pixel local_44;
  pixel dest [7];
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
  blackness;
  uint8_t covers [7];
  pixel white;
  int n;
  GenericRGBXBlenderTests *this_local;
  
  stack0xffffffffffffffec = 7;
  covers[0] = 0xff;
  covers[1] = 0xff;
  covers[2] = 0xff;
  covers[3] = 0xff;
  blackness._a._0_3_ = 0xfff081;
  blackness._color.r = '\0';
  blackness._color.g = '\x12';
  blackness._color.b = '!';
  blackness._color.a = 'q';
  dest[5].components = (uint8_t  [4])color::make('\0','\0','\0',0xff);
  this_00 = (blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
             *)(dest + 6);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  blender_solid_color_rgb(this_00,(color)dest[5].components);
  std::
  fill_n<agge::tests::mocks::pixel_rgbx<agge::order_rgba>*,int,agge::tests::mocks::pixel_rgbx<agge::order_rgba>>
            (reference + 6,7,(pixel_rgbx<agge::order_rgba> *)covers);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,reference + 6,0,0,1,(cover_type *)&blackness);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,&local_44,0,0,1,&blackness._color.g);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,dest,0,0,1,&blackness._color.b);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,dest + 1,0,0,1,&blackness._color.a);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,dest + 2,0,0,1,(cover_type *)&blackness._a);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,dest + 3,0,0,1,(cover_type *)((long)&blackness._a + 1));
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,dest + 4,0,0,1,(cover_type *)((long)&blackness._a + 2));
  builtin_memcpy(reference[2].components,"~~~~",4);
  builtin_memcpy(reference[3].components,"\x0f\x0f\x0f\x0f",4);
  reference[4].components[0] = '\0';
  reference[4].components[1] = '\0';
  reference[4].components[2] = '\0';
  reference[4].components[3] = '\0';
  local_68._0_1_ = 0xff;
  local_68._1_1_ = 0xff;
  local_68._2_1_ = 0xff;
  local_68._3_1_ = 0xff;
  local_68._4_1_ = 0xed;
  local_68._5_1_ = 0xed;
  local_68._6_1_ = 0xed;
  local_68._7_1_ = 0xed;
  reference[0].components[0] = 0xde;
  reference[0].components[1] = 0xde;
  reference[0].components[2] = 0xde;
  reference[0].components[3] = 0xde;
  reference[1].components[0] = 0x8e;
  reference[1].components[1] = 0x8e;
  reference[1].components[2] = 0x8e;
  reference[1].components[3] = 0x8e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_b1);
  ut::LocationInfo::LocationInfo(&local_90,(string *)local_b0,99);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>,7ul>
            ((pixel_rgbx<agge::order_rgba> (*) [7])&local_68,
             (pixel_rgbx<agge::order_rgba> (*) [7])(reference + 6),&local_90);
  ut::LocationInfo::~LocationInfo(&local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  return;
}

Assistant:

test( BlendingBlackOnWhiteProducesGrayDependingOnInvertedCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 7;
				const pixel white = { { 0xFF, 0xFF, 0xFF, 0xFF } };
				const uint8_t covers[n] = { 0x00, 0x12, 0x21, 0x71, 0x81, 0xF0, 0xFF };
				blender_solid_color_rgb<pixel, order_rgba> blackness(color::make(0x00, 0x00, 0x00));
				pixel dest[n];

				fill_n(dest, n, white);

				// ACT
				blackness(dest + 0, 0, 0, 1, covers + 0);
				blackness(dest + 1, 0, 0, 1, covers + 1);
				blackness(dest + 2, 0, 0, 1, covers + 2);
				blackness(dest + 3, 0, 0, 1, covers + 3);
				blackness(dest + 4, 0, 0, 1, covers + 4);
				blackness(dest + 5, 0, 0, 1, covers + 5);
				blackness(dest + 6, 0, 0, 1, covers + 6);

				// ASSERT
				pixel reference[] = {
					{ { 0xFF, 0xFF, 0xFF, 0xFF } },
					{ { 0xED, 0xED, 0xED, 0xED } },
					{ { 0xDE, 0xDE, 0xDE, 0xDE } },
					{ { 0x8E, 0x8E, 0x8E, 0x8E } },
					{ { 0x7E, 0x7E, 0x7E, 0x7E } },
					{ { 0x0F, 0x0F, 0x0F, 0x0F } },
					{ { 0x00, 0x00, 0x00, 0x00 } },
				};

				assert_equal(reference, dest);
			}